

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-strip.cc
# Opt level: O0

void __thiscall BinaryReaderStrip::~BinaryReaderStrip(BinaryReaderStrip *this)

{
  BinaryReaderStrip *this_local;
  
  (this->super_BinaryReaderNop).super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
       (_func_int **)&PTR__BinaryReaderStrip_00182f10;
  std::
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~set(&this->sections_to_keep_);
  wabt::MemoryStream::~MemoryStream(&this->stream_);
  wabt::BinaryReaderNop::~BinaryReaderNop(&this->super_BinaryReaderNop);
  return;
}

Assistant:

explicit BinaryReaderStrip(std::set<std::string_view> sections_to_keep,
                             Errors* errors)
      : errors_(errors),
        sections_to_keep_(sections_to_keep),
        section_start_(0) {
    stream_.WriteU32(WABT_BINARY_MAGIC, "WASM_BINARY_MAGIC");
    stream_.WriteU32(WABT_BINARY_VERSION, "WASM_BINARY_VERSION");
  }